

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  bool bVar1;
  reference key;
  Value *pVVar2;
  PathArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  Args *__range1;
  Value *node;
  Value *root_local;
  Path *this_local;
  
  __end1 = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(&this->args_)
  ;
  arg = (PathArgument *)
        std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(&this->args_);
  __range1 = (Args *)root;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                                *)&arg);
    if (!bVar1) {
      return (Value *)__range1;
    }
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&__end1);
    if (key->kind_ == kindIndex) {
      bVar1 = Value::isArray((Value *)__range1);
      if ((!bVar1) || (bVar1 = Value::isValidIndex((Value *)__range1,key->index_), !bVar1)) {
        pVVar2 = Value::nullSingleton();
        return pVVar2;
      }
      __range1 = (Args *)Value::operator[]((Value *)__range1,key->index_);
    }
    else if (key->kind_ == kindKey) {
      bVar1 = Value::isObject((Value *)__range1);
      if (!bVar1) {
        pVVar2 = Value::nullSingleton();
        return pVVar2;
      }
      __range1 = (Args *)Value::operator[]((Value *)__range1,&key->key_);
      pVVar2 = Value::nullSingleton();
      if ((Value *)__range1 == pVVar2) {
        pVVar2 = Value::nullSingleton();
        return pVVar2;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position... )
        return Value::nullSingleton();
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
        return Value::nullSingleton();
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton()) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
        return Value::nullSingleton();
      }
    }
  }
  return *node;
}